

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,VariableDeclarationNode *node)

{
  SymbolTable *this_00;
  element_type *peVar1;
  optional<TypeName> *poVar2;
  TypeName *__k;
  mapped_type *__rhs;
  optional<std::reference_wrapper<Symbol>_> oVar3;
  _Head_base<0UL,_Symbol_*,_false> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  TypeChecker typeChecker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&name,(string *)&node->name_);
  this_00 = &this->symbols_;
  oVar3 = SymbolTable::lookup(this_00,&name,1);
  if (((undefined1  [16])
       oVar3.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    std::operator+(&local_98,"Redefinition of variable ",&name);
    std::operator+(&local_d8,&local_98,"!");
    reportError(&local_d8,(Node *)node);
  }
  peVar1 = (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_Node)._vptr_Node[2])(peVar1,this);
  typeChecker.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_00148e98;
  typeChecker.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName>._M_engaged = false;
  typeChecker.symbols_ = this_00;
  (*(((node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Node)._vptr_Node[2])();
  poVar2 = TypeChecker::getType(&typeChecker);
  if ((poVar2->super__Optional_base<TypeName,_true,_true>)._M_payload.
      super__Optional_payload_base<TypeName>._M_engaged == true) {
    poVar2 = TypeChecker::getType(&typeChecker);
    if (((poVar2->super__Optional_base<TypeName,_true,_true>)._M_payload.
         super__Optional_payload_base<TypeName>._M_engaged != true) ||
       ((poVar2->super__Optional_base<TypeName,_true,_true>)._M_payload.
        super__Optional_payload_base<TypeName>._M_payload._M_value != node->type_)) {
      poVar2 = TypeChecker::getType(&typeChecker);
      __k = std::optional<TypeName>::value(poVar2);
      __rhs = std::__detail::
              _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&TypeNameStrings_abi_cxx11_,__k);
      std::operator+(&local_60,"Cannot assign value of type ",__rhs);
      std::operator+(&local_40,&local_60," to variable ");
      std::operator+(&local_98,&local_40,&name);
      std::operator+(&local_d8,&local_98,"!");
      reportError(&local_d8,(Node *)node);
    }
  }
  std::make_unique<VariableSymbol,std::__cxx11::string_const&,TypeName_const&>
            (&local_d8,(TypeName *)&name);
  local_e0._M_head_impl = (Symbol *)local_d8._M_dataplus._M_p;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  SymbolTable::addSymbol
            (this_00,&name,(unique_ptr<Symbol,_std::default_delete<Symbol>_> *)&local_e0);
  if (local_e0._M_head_impl != (Symbol *)0x0) {
    (*(local_e0._M_head_impl)->_vptr_Symbol[1])();
  }
  local_e0._M_head_impl = (Symbol *)0x0;
  if ((long *)local_d8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SemanticAnalyser::visit(const VariableDeclarationNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name, 1);
  if(symbol)
    reportError("Redefinition of variable " + name + "!", node);
  
  node.getValue()->accept(*this);

  TypeChecker typeChecker{symbols_};
  node.getValue()->accept(typeChecker);

  // Type checker is not able to deduce expression's type when variable was called
  // and in that case getType has no value.
  if(typeChecker.getType().has_value() && typeChecker.getType() != node.getType())
    reportError("Cannot assign value of type " + 
      TypeNameStrings.at(typeChecker.getType().value()) + " to variable " + name + "!", node);

  auto variableSymbol = std::make_unique<VariableSymbol>(name, node.getType());
  symbols_.addSymbol(name, std::move(variableSymbol));
}